

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O2

bool __thiscall
cmTargetPropCommandBase::ProcessContentArgs
          (cmTargetPropCommandBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,uint *argIndex,bool prepend,bool system)

{
  pointer pbVar1;
  cmTargetPropCommandBase *this_00;
  bool bVar2;
  cmTarget *pcVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000081;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  content;
  allocator<char> local_81;
  undefined4 local_80;
  undefined4 local_7c;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  cmTargetPropCommandBase *local_38;
  
  local_7c = (undefined4)CONCAT71(in_register_00000081,system);
  local_80 = (undefined4)CONCAT71(in_register_00000009,prepend);
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + *argIndex;
  bVar2 = std::operator!=(pbVar5,"PUBLIC");
  if (((bVar2) && (bVar2 = std::operator!=(pbVar5,"PRIVATE"), bVar2)) &&
     (bVar2 = std::operator!=(pbVar5,"INTERFACE"), bVar2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"called with invalid arguments",(allocator<char> *)&local_58);
    cmCommand::SetError(&this->super_cmCommand,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    return false;
  }
  uVar4 = *argIndex + 1;
  *argIndex = uVar4;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = pbVar5;
  local_38 = this;
  while( true ) {
    uVar6 = (ulong)uVar4;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar6)
    break;
    bVar2 = std::operator==(pbVar1 + uVar6,"PUBLIC");
    if (((bVar2) ||
        (bVar2 = std::operator==((args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + uVar6,"PRIVATE"),
        bVar2)) ||
       (bVar2 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar6,"INTERFACE"),
       bVar2)) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_58,
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + uVar6);
    uVar4 = uVar4 + 1;
    *argIndex = *argIndex + 1;
  }
  this_00 = local_38;
  pbVar5 = local_40;
  if (local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001ee4e3:
    bVar2 = PopulateTargetProperies(this_00,pbVar5,&local_58,local_80._0_1_,local_7c._0_1_);
  }
  else {
    pcVar3 = local_38->Target;
    if (pcVar3->TargetTypeValue == INTERFACE_LIBRARY) {
      bVar2 = std::operator!=(local_40,"INTERFACE");
      if (!bVar2) {
        pcVar3 = this_00->Target;
        goto LAB_001ee496;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"may only set INTERFACE properties on INTERFACE targets",
                 &local_81);
      cmCommand::SetError(&this_00->super_cmCommand,&local_78);
    }
    else {
LAB_001ee496:
      if ((pcVar3->IsImportedTarget != true) ||
         (bVar2 = std::operator!=(pbVar5,"INTERFACE"), !bVar2)) goto LAB_001ee4e3;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"may only set INTERFACE properties on IMPORTED targets",
                 &local_81);
      cmCommand::SetError(&this_00->super_cmCommand,&local_78);
    }
    std::__cxx11::string::~string((string *)&local_78);
    bVar2 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return bVar2;
}

Assistant:

bool cmTargetPropCommandBase::ProcessContentArgs(
  std::vector<std::string> const& args, unsigned int& argIndex, bool prepend,
  bool system)
{
  std::string const& scope = args[argIndex];

  if (scope != "PUBLIC" && scope != "PRIVATE" && scope != "INTERFACE") {
    this->SetError("called with invalid arguments");
    return false;
  }

  ++argIndex;

  std::vector<std::string> content;

  for (unsigned int i = argIndex; i < args.size(); ++i, ++argIndex) {
    if (args[i] == "PUBLIC" || args[i] == "PRIVATE" ||
        args[i] == "INTERFACE") {
      break;
    }
    content.push_back(args[i]);
  }
  if (!content.empty()) {
    if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
        scope != "INTERFACE") {
      this->SetError("may only set INTERFACE properties on INTERFACE targets");
      return false;
    }
    if (this->Target->IsImported() && scope != "INTERFACE") {
      this->SetError("may only set INTERFACE properties on IMPORTED targets");
      return false;
    }
  }
  return this->PopulateTargetProperies(scope, content, prepend, system);
}